

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_zlib_header(stbi__zbuf *a)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  stbi__zbuf *in_RDI;
  int flg;
  int cm;
  int cmf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  bVar1 = stbi__zget8((stbi__zbuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  bVar2 = stbi__zget8((stbi__zbuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  uVar3 = (uint)bVar2;
  iVar4 = stbi__zeof(in_RDI);
  if (iVar4 == 0) {
    if ((int)((uint)bVar1 * 0x100 + uVar3) % 0x1f == 0) {
      if ((uVar3 & 0x20) == 0) {
        if ((bVar1 & 0xf) == 8) {
          local_4 = 1;
        }
        else {
          local_4 = stbi__err((char *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
        }
      }
      else {
        local_4 = stbi__err((char *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
      }
    }
    else {
      local_4 = stbi__err((char *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
    }
  }
  else {
    local_4 = stbi__err((char *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
  }
  return local_4;
}

Assistant:

static int stbi__parse_zlib_header(stbi__zbuf *a)
{
   int cmf   = stbi__zget8(a);
   int cm    = cmf & 15;
   /* int cinfo = cmf >> 4; */
   int flg   = stbi__zget8(a);
   if (stbi__zeof(a)) return stbi__err("bad zlib header","Corrupt PNG"); // zlib spec
   if ((cmf*256+flg) % 31 != 0) return stbi__err("bad zlib header","Corrupt PNG"); // zlib spec
   if (flg & 32) return stbi__err("no preset dict","Corrupt PNG"); // preset dictionary not allowed in png
   if (cm != 8) return stbi__err("bad compression","Corrupt PNG"); // DEFLATE required for png
   // window = 1 << (8 + cinfo)... but who cares, we fully buffer output
   return 1;
}